

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAlloc(sqlite3 *db,int op,Token *pToken,int dequote)

{
  int iVar1;
  int local_38;
  int local_34;
  int iValue;
  int nExtra;
  Expr *pNew;
  Token *pTStack_20;
  int dequote_local;
  Token *pToken_local;
  sqlite3 *psStack_10;
  int op_local;
  sqlite3 *db_local;
  
  local_34 = 0;
  local_38 = 0;
  pNew._4_4_ = dequote;
  pTStack_20 = pToken;
  pToken_local._4_4_ = op;
  psStack_10 = db;
  if ((pToken != (Token *)0x0) &&
     (((op != 0x93 || (pToken->z == (char *)0x0)) ||
      (iVar1 = sqlite3GetInt32(pToken->z,&local_38), iVar1 == 0)))) {
    local_34 = pTStack_20->n + 1;
  }
  _iValue = (Expr *)sqlite3DbMallocRawNN(psStack_10,(long)local_34 + 0x48);
  if (_iValue != (Expr *)0x0) {
    memset(_iValue,0,0x48);
    _iValue->op = (u8)pToken_local._4_4_;
    _iValue->iAgg = -1;
    if (pTStack_20 != (Token *)0x0) {
      if (local_34 == 0) {
        _iValue->flags = _iValue->flags | 0x800400;
        (_iValue->u).iValue = local_38;
      }
      else {
        (_iValue->u).zToken = (char *)(_iValue + 1);
        if (pTStack_20->n != 0) {
          memcpy((_iValue->u).zToken,pTStack_20->z,(ulong)pTStack_20->n);
        }
        (_iValue->u).zToken[pTStack_20->n] = '\0';
        if ((pNew._4_4_ != 0) && ((""[(byte)*(_iValue->u).zToken] & 0x80) != 0)) {
          sqlite3DequoteExpr(_iValue);
        }
      }
    }
    _iValue->nHeight = 1;
  }
  return _iValue;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAlloc(
  sqlite3 *db,            /* Handle for sqlite3DbMallocRawNN() */
  int op,                 /* Expression opcode */
  const Token *pToken,    /* Token argument.  Might be NULL */
  int dequote             /* True to dequote */
){
  Expr *pNew;
  int nExtra = 0;
  int iValue = 0;

  assert( db!=0 );
  if( pToken ){
    if( op!=TK_INTEGER || pToken->z==0
          || sqlite3GetInt32(pToken->z, &iValue)==0 ){
      nExtra = pToken->n+1;
      assert( iValue>=0 );
    }
  }
  pNew = sqlite3DbMallocRawNN(db, sizeof(Expr)+nExtra);
  if( pNew ){
    memset(pNew, 0, sizeof(Expr));
    pNew->op = (u8)op;
    pNew->iAgg = -1;
    if( pToken ){
      if( nExtra==0 ){
        pNew->flags |= EP_IntValue|EP_Leaf;
        pNew->u.iValue = iValue;
      }else{
        pNew->u.zToken = (char*)&pNew[1];
        assert( pToken->z!=0 || pToken->n==0 );
        if( pToken->n ) memcpy(pNew->u.zToken, pToken->z, pToken->n);
        pNew->u.zToken[pToken->n] = 0;
        if( dequote && sqlite3Isquote(pNew->u.zToken[0]) ){
          sqlite3DequoteExpr(pNew);
        }
      }
    }
#if SQLITE_MAX_EXPR_DEPTH>0
    pNew->nHeight = 1;
#endif  
  }
  return pNew;
}